

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  int iVar1;
  PGroup *pPVar2;
  PCache1 *pPVar3;
  PgHdr1 *pPVar4;
  PgHdr1 *pPVar5;
  PgHdr1 **ppPVar6;
  int iVar7;
  void *pvVar8;
  u64 uVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  PgHdr1 **ppPVar14;
  u64 n;
  PgHdr1 *pPVar15;
  
  pPVar2 = pCache->pGroup;
  if (createFlag == 1) {
    uVar13 = pCache->nPage - pCache->nRecyclable;
    if (pPVar2->mxPinned <= uVar13) {
      return (PgHdr1 *)0x0;
    }
    if (pCache->n90pct <= uVar13) {
      return (PgHdr1 *)0x0;
    }
    if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
      piVar10 = &mem0.nearlyFull;
    }
    else {
      piVar10 = &pcache1_g.bUnderPressure;
    }
    if (*piVar10 != 0 && pCache->nRecyclable < uVar13) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= pCache->nPage) {
    pcache1ResizeHash(pCache);
  }
  if ((pCache->bPurgeable != 0) && (pPVar15 = (pPVar2->lru).pLruPrev, pPVar15->isAnchor == '\0')) {
    if (pCache->nPage + 1 < pCache->nMax) {
      if ((pcache1_g.nSlot == 0) || (pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
        piVar10 = &mem0.nearlyFull;
      }
      else {
        piVar10 = &pcache1_g.bUnderPressure;
      }
      if (*piVar10 == 0) goto LAB_00180eca;
    }
    pPVar3 = pPVar15->pCache;
    ppPVar6 = pPVar3->apHash + (ulong)pPVar15->iKey % (ulong)pPVar3->nHash;
    do {
      ppPVar14 = ppPVar6;
      pPVar4 = *ppPVar14;
      ppPVar6 = &pPVar4->pNext;
    } while (pPVar4 != pPVar15);
    *ppPVar14 = *ppPVar6;
    pPVar3->nPage = pPVar3->nPage - 1;
    pPVar4 = pPVar15->pLruNext;
    pPVar5 = pPVar15->pLruPrev;
    pPVar5->pLruNext = pPVar4;
    pPVar4->pLruPrev = pPVar5;
    pPVar15->pLruNext = (PgHdr1 *)0x0;
    pPVar15->pLruPrev = (PgHdr1 *)0x0;
    pPVar3 = pPVar15->pCache;
    pPVar3->nRecyclable = pPVar3->nRecyclable - 1;
    if (pPVar3->szAlloc == pCache->szAlloc) {
      pPVar2->nPurgeable = pPVar2->nPurgeable + (pCache->bPurgeable - pPVar3->bPurgeable);
      goto LAB_00180f92;
    }
    pcache1FreePage(pPVar15);
  }
LAB_00180eca:
  pPVar15 = pCache->pFree;
  if (pPVar15 == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (pcache1_g.nInitPage < 1) {
        uVar9 = (long)pcache1_g.nInitPage * -0x400;
        lVar12 = (long)pCache->szAlloc;
      }
      else {
        lVar12 = (long)pCache->szAlloc;
        uVar9 = (ulong)(uint)pcache1_g.nInitPage * lVar12;
      }
      n = (ulong)pCache->nMax * lVar12;
      if ((long)uVar9 < (long)n) {
        n = uVar9;
      }
      pvVar8 = sqlite3Malloc(n);
      pCache->pBulk = pvVar8;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar8 == (void *)0x0) {
        pPVar15 = pCache->pFree;
        if (pPVar15 == (PgHdr1 *)0x0) goto LAB_00180ef3;
      }
      else {
        iVar7 = (*sqlite3Config.m.xSize)(pvVar8);
        iVar1 = pCache->szAlloc;
        uVar11 = (long)iVar7 / (long)iVar1 & 0xffffffff;
        lVar12 = (long)pCache->szPage;
        pPVar15 = pCache->pFree;
        do {
          *(void **)((long)pvVar8 + lVar12) = pvVar8;
          *(long *)((long)pvVar8 + lVar12 + 8) = (long)pvVar8 + lVar12 + 0x38;
          *(undefined2 *)((long)pvVar8 + lVar12 + 0x14) = 1;
          *(PgHdr1 **)((long)pvVar8 + lVar12 + 0x18) = pPVar15;
          pPVar15 = (PgHdr1 *)((long)pvVar8 + lVar12);
          pvVar8 = (void *)((long)pvVar8 + (long)iVar1);
          uVar13 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar13;
        } while (uVar13 != 0);
        pPVar15 = (PgHdr1 *)((long)pvVar8 + (lVar12 - iVar1));
      }
      goto LAB_00180ed3;
    }
LAB_00180ef3:
    if (createFlag == 1) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pvVar8 = pcache1Alloc(pCache->szAlloc);
      pPVar15 = (PgHdr1 *)((long)pCache->szPage + (long)pvVar8);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
    }
    else {
      pvVar8 = pcache1Alloc(pCache->szAlloc);
      pPVar15 = (PgHdr1 *)((long)pCache->szPage + (long)pvVar8);
    }
    if (pvVar8 == (void *)0x0) {
      return (PgHdr1 *)0x0;
    }
    (pPVar15->page).pBuf = pvVar8;
    (pPVar15->page).pExtra = pPVar15 + 1;
    pPVar15->isBulkLocal = '\0';
    pPVar15->isAnchor = '\0';
  }
  else {
LAB_00180ed3:
    pCache->pFree = pPVar15->pNext;
    pPVar15->pNext = (PgHdr1 *)0x0;
  }
  *pCache->pnPurgeable = *pCache->pnPurgeable + 1;
LAB_00180f92:
  uVar11 = (ulong)iKey % (ulong)pCache->nHash;
  pCache->nPage = pCache->nPage + 1;
  pPVar15->iKey = iKey;
  pPVar15->pNext = pCache->apHash[uVar11];
  pPVar15->pCache = pCache;
  pPVar15->pLruNext = (PgHdr1 *)0x0;
  pPVar15->pLruPrev = (PgHdr1 *)0x0;
  *(undefined8 *)(pPVar15->page).pExtra = 0;
  pCache->apHash[uVar11] = pPVar15;
  if (pCache->iMaxKey < iKey) {
    pCache->iMaxKey = iKey;
  }
  return pPVar15;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache, 
  unsigned int iKey, 
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found, 
  ** attempt to allocate a new one. 
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruPrev = 0;
    pPage->pLruNext = 0;
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}